

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_parser_initialize(yaml_parser_t *parser)

{
  uchar *__ptr;
  yaml_char_t *__ptr_00;
  yaml_token_t *__ptr_01;
  int *__ptr_02;
  yaml_simple_key_t *pyVar1;
  yaml_parser_state_t *pyVar2;
  yaml_mark_t *pyVar3;
  yaml_tag_directive_t *pyVar4;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0xb3,"int yaml_parser_initialize(yaml_parser_t *)");
  }
  memset(parser,0,0x1e0);
  __ptr = (uchar *)malloc(0x4000);
  (parser->raw_buffer).start = __ptr;
  if (__ptr == (uchar *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
    (parser->buffer).start = (yaml_char_t *)0x0;
    (parser->buffer).end = (yaml_char_t *)0x0;
    (parser->buffer).pointer = (yaml_char_t *)0x0;
    (parser->raw_buffer).pointer = (uchar *)0x0;
    (parser->raw_buffer).start = (uchar *)0x0;
    (parser->raw_buffer).end = (uchar *)0x0;
    (parser->tokens).head = (yaml_token_t *)0x0;
    (parser->tokens).tail = (yaml_token_t *)0x0;
    (parser->tokens).start = (yaml_token_t *)0x0;
    (parser->tokens).end = (yaml_token_t *)0x0;
    goto LAB_00102f1b;
  }
  (parser->raw_buffer).pointer = __ptr;
  (parser->raw_buffer).last = __ptr;
  (parser->raw_buffer).end = __ptr + 0x4000;
  __ptr_00 = (yaml_char_t *)malloc(0xc000);
  (parser->buffer).start = __ptr_00;
  if (__ptr_00 == (yaml_char_t *)0x0) {
LAB_00102e6e:
    __ptr_02 = (int *)0x0;
    __ptr_01 = (yaml_token_t *)0x0;
  }
  else {
    (parser->buffer).pointer = __ptr_00;
    (parser->buffer).last = __ptr_00;
    (parser->buffer).end = __ptr_00 + 0xc000;
    __ptr_01 = (yaml_token_t *)malloc(0x500);
    (parser->tokens).start = __ptr_01;
    if (__ptr_01 == (yaml_token_t *)0x0) goto LAB_00102e6e;
    (parser->tokens).tail = __ptr_01;
    (parser->tokens).head = __ptr_01;
    (parser->tokens).end = __ptr_01 + 0x10;
    __ptr_02 = (int *)malloc(0x40);
    (parser->indents).start = __ptr_02;
    if (__ptr_02 == (int *)0x0) {
      __ptr_02 = (int *)0x0;
    }
    else {
      (parser->indents).top = __ptr_02;
      (parser->indents).end = __ptr_02 + 0x10;
      pyVar1 = (yaml_simple_key_t *)malloc(0x280);
      (parser->simple_keys).start = pyVar1;
      if (pyVar1 != (yaml_simple_key_t *)0x0) {
        (parser->simple_keys).top = pyVar1;
        (parser->simple_keys).end = pyVar1 + 0x10;
        pyVar2 = (yaml_parser_state_t *)malloc(0x40);
        (parser->states).start = pyVar2;
        if (pyVar2 != (yaml_parser_state_t *)0x0) {
          (parser->states).top = pyVar2;
          (parser->states).end = pyVar2 + 0x10;
          pyVar3 = (yaml_mark_t *)malloc(0x180);
          (parser->marks).start = pyVar3;
          if (pyVar3 != (yaml_mark_t *)0x0) {
            (parser->marks).top = pyVar3;
            (parser->marks).end = pyVar3 + 0x10;
            pyVar4 = (yaml_tag_directive_t *)malloc(0x100);
            (parser->tag_directives).start = pyVar4;
            if (pyVar4 != (yaml_tag_directive_t *)0x0) {
              (parser->tag_directives).top = pyVar4;
              (parser->tag_directives).end = pyVar4 + 0x10;
              return 1;
            }
          }
        }
      }
    }
  }
  parser->error = YAML_MEMORY_ERROR;
  free(__ptr);
  (parser->raw_buffer).start = (uchar *)0x0;
  (parser->raw_buffer).end = (uchar *)0x0;
  (parser->raw_buffer).pointer = (uchar *)0x0;
  if (__ptr_00 != (yaml_char_t *)0x0) {
    free(__ptr_00);
  }
  (parser->buffer).start = (yaml_char_t *)0x0;
  (parser->buffer).end = (yaml_char_t *)0x0;
  (parser->buffer).pointer = (yaml_char_t *)0x0;
  if (__ptr_01 != (yaml_token_t *)0x0) {
    free(__ptr_01);
    __ptr_02 = (parser->indents).start;
  }
  (parser->tokens).head = (yaml_token_t *)0x0;
  (parser->tokens).tail = (yaml_token_t *)0x0;
  (parser->tokens).start = (yaml_token_t *)0x0;
  (parser->tokens).end = (yaml_token_t *)0x0;
  if (__ptr_02 != (int *)0x0) {
    free(__ptr_02);
  }
LAB_00102f1b:
  (parser->indents).end = (int *)0x0;
  (parser->indents).top = (int *)0x0;
  (parser->indents).start = (int *)0x0;
  pyVar1 = (parser->simple_keys).start;
  if (pyVar1 != (yaml_simple_key_t *)0x0) {
    free(pyVar1);
  }
  (parser->simple_keys).start = (yaml_simple_key_t *)0x0;
  (parser->simple_keys).end = (yaml_simple_key_t *)0x0;
  (parser->simple_keys).top = (yaml_simple_key_t *)0x0;
  pyVar2 = (parser->states).start;
  if (pyVar2 != (yaml_parser_state_t *)0x0) {
    free(pyVar2);
  }
  (parser->states).start = (yaml_parser_state_t *)0x0;
  (parser->states).end = (yaml_parser_state_t *)0x0;
  (parser->states).top = (yaml_parser_state_t *)0x0;
  pyVar3 = (parser->marks).start;
  if (pyVar3 != (yaml_mark_t *)0x0) {
    free(pyVar3);
  }
  (parser->marks).start = (yaml_mark_t *)0x0;
  (parser->marks).end = (yaml_mark_t *)0x0;
  (parser->marks).top = (yaml_mark_t *)0x0;
  pyVar4 = (parser->tag_directives).start;
  if (pyVar4 != (yaml_tag_directive_t *)0x0) {
    free(pyVar4);
  }
  (parser->tag_directives).start = (yaml_tag_directive_t *)0x0;
  (parser->tag_directives).end = (yaml_tag_directive_t *)0x0;
  (parser->tag_directives).top = (yaml_tag_directive_t *)0x0;
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_initialize(yaml_parser_t *parser)
{
    assert(parser);     /* Non-NULL parser object expected. */

    memset(parser, 0, sizeof(yaml_parser_t));
    if (!BUFFER_INIT(parser, parser->raw_buffer, INPUT_RAW_BUFFER_SIZE))
        goto error;
    if (!BUFFER_INIT(parser, parser->buffer, INPUT_BUFFER_SIZE))
        goto error;
    if (!QUEUE_INIT(parser, parser->tokens, INITIAL_QUEUE_SIZE, yaml_token_t*))
        goto error;
    if (!STACK_INIT(parser, parser->indents, int*))
        goto error;
    if (!STACK_INIT(parser, parser->simple_keys, yaml_simple_key_t*))
        goto error;
    if (!STACK_INIT(parser, parser->states, yaml_parser_state_t*))
        goto error;
    if (!STACK_INIT(parser, parser->marks, yaml_mark_t*))
        goto error;
    if (!STACK_INIT(parser, parser->tag_directives, yaml_tag_directive_t*))
        goto error;

    return 1;

error:

    BUFFER_DEL(parser, parser->raw_buffer);
    BUFFER_DEL(parser, parser->buffer);
    QUEUE_DEL(parser, parser->tokens);
    STACK_DEL(parser, parser->indents);
    STACK_DEL(parser, parser->simple_keys);
    STACK_DEL(parser, parser->states);
    STACK_DEL(parser, parser->marks);
    STACK_DEL(parser, parser->tag_directives);

    return 0;
}